

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  void *pvVar13;
  int *piVar14;
  float *pfVar15;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int in_stack_00000008;
  int in_stack_00000010;
  float sum0;
  float sum0_tmp [4];
  __m128 _k0;
  __m128 _p0;
  __m128 _sum0_4;
  int k_3;
  float *va_3;
  float *vb_3;
  __m128 _vb0_3;
  __m128 _va0_4;
  __m128 _vb3_1;
  __m128 _vb2_1;
  __m128 _vb1_1;
  __m128 _vb0_2;
  __m128 _va3_3;
  __m128 _va2_3;
  __m128 _va1_3;
  __m128 _va0_3;
  int k_2;
  __m128 _sum0_2;
  float *va_2;
  float *vb_2;
  int j_2;
  float bias0;
  float *output;
  int i_4;
  float sum0_3_tmp [4];
  __m128 _va;
  __m128 _vb0_1;
  __m128 _va3_2;
  __m128 _va2_2;
  __m128 _va1_2;
  __m128 _va0_2;
  __m128 _vb3;
  __m128 _vb2;
  __m128 _vb1;
  __m128 _vb0;
  int k_1;
  __m128 _sum3_1;
  __m128 _sum2_1;
  __m128 _sum1_1;
  __m128 _sum0_1;
  __m128 _sum0_3;
  float *va_1;
  float *vb_1;
  __m128 _va3_1;
  __m128 _va2_1;
  __m128 _va1_1;
  __m128 _va0_1;
  __m128 _vb_1;
  __m128 _va3;
  __m128 _va2;
  __m128 _va1;
  __m128 _va0;
  __m128 _vb;
  int k;
  __m128 _sum3;
  __m128 _sum2;
  __m128 _sum1;
  __m128 _sum0;
  float *va;
  float *vb;
  int j_1;
  float *biasptr;
  float zeros [4];
  float *output3;
  float *output2;
  float *output1;
  float *output0;
  int i_3;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int L;
  int N;
  int q_1;
  float *tmpptr_1;
  float *img0_1;
  int i_2;
  int q;
  float *tmpptr;
  float *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int j;
  int i;
  int v;
  int u;
  int retID;
  float *input;
  int p;
  float *ret;
  int stride;
  Mat bottom_im2col;
  float *bias;
  int outch;
  int outh;
  int outw;
  size_t elemsize;
  int inch;
  int w;
  Allocator *in_stack_ffffffffffffe638;
  size_t in_stack_ffffffffffffe640;
  undefined8 in_stack_ffffffffffffe648;
  Mat *in_stack_ffffffffffffe650;
  float in_stack_ffffffffffffe664;
  Mat *in_stack_ffffffffffffe668;
  float *local_1970;
  float local_190c;
  undefined1 local_1908 [16];
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  int local_18bc;
  Mat local_18b8;
  float *local_1870;
  Mat local_1868;
  float *local_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  int local_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  Mat local_1758;
  float *local_1710;
  Mat local_1708;
  float *local_16c0;
  int local_16b8;
  float local_16b4;
  Mat local_16b0;
  Mat *local_1668;
  int local_165c;
  undefined1 local_1658 [16];
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  int local_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  Mat local_1548;
  float *local_1500;
  Mat local_14f8;
  float *local_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  int local_13fc;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  Mat local_13b8;
  float *local_1370;
  Mat local_1368;
  float *local_1320;
  int local_1314;
  float *local_1310;
  float local_1308 [4];
  Mat local_12f8;
  float *local_12b0;
  Mat local_12a8;
  float *local_1260;
  Mat local_1258;
  float *local_1210;
  Mat local_1208;
  float *local_11c0;
  int local_11b4;
  int local_11b0;
  int local_11ac;
  int local_11a8;
  int local_11a4;
  int local_11a0;
  int local_119c;
  Mat local_1198;
  float *local_1150;
  Mat local_1148;
  float *local_1100;
  int local_10f8;
  int local_10f4;
  Mat local_10f0;
  float *local_10a8;
  Mat local_10a0;
  float *local_1058;
  int local_1050;
  int local_104c;
  int local_1048;
  int local_1044;
  int local_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  int local_fe8;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  Mat local_fd0;
  float *local_f88;
  int local_f80;
  float *local_f70;
  int local_f64;
  Mat local_f60;
  float *local_f18;
  int local_f0c;
  int local_f08;
  int local_f04;
  undefined8 local_f00;
  int local_ef8;
  int local_ef4;
  int local_ef0;
  int local_eec;
  undefined4 local_ec8;
  undefined4 uStack_ec4;
  undefined4 uStack_ec0;
  undefined4 uStack_ebc;
  undefined4 local_eb8;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float local_e98;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e78;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_e4c;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  float local_e2c;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  float local_e0c;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  float local_df8;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  float local_dd8;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  float local_db8;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  float local_d8c;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  float local_d6c;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float local_d4c;
  undefined4 local_d48;
  undefined4 uStack_d44;
  undefined4 uStack_d40;
  undefined4 uStack_d3c;
  undefined4 local_d38;
  undefined4 local_d28;
  undefined4 uStack_d24;
  undefined4 uStack_d20;
  undefined4 uStack_d1c;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined4 uStack_d04;
  undefined4 uStack_d00;
  undefined4 uStack_cfc;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 uStack_ce4;
  undefined4 uStack_ce0;
  undefined4 uStack_cdc;
  undefined4 local_ccc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_cb8;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c6c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c4c;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c38;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c0c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bec;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bac;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b8c;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b6c;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d4;
  float *local_9d0;
  float *local_9c8;
  float *local_9c0;
  float *local_9b8;
  float *local_9b0;
  float *local_9a8;
  float *local_9a0;
  float *local_998;
  float *local_990;
  float *local_988;
  float *local_980;
  float *local_978;
  float *local_970;
  float *local_968;
  float *local_960;
  float *local_958;
  float *local_950;
  float *local_948;
  float *local_940;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e0;
  void *local_d8;
  int *piStack_d0;
  Mat *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_ef4 = *(int *)(in_RDI + 0x2c);
  local_ef8 = *(int *)(in_RDI + 0x38);
  local_f00 = *(undefined8 *)(in_RDI + 0x10);
  local_f04 = *(int *)(in_RSI + 0x2c);
  local_f08 = *(int *)(in_RSI + 0x30);
  local_f0c = *(int *)(in_RSI + 0x38);
  local_ef0 = in_R9D;
  local_eec = in_R8D;
  local_f18 = Mat::operator_cast_to_float_(in_RCX);
  Mat::Mat(in_stack_ffffffffffffe650,(int)((ulong)in_stack_ffffffffffffe648 >> 0x20),
           (int)in_stack_ffffffffffffe648,in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
  local_f64 = local_ef0 * local_eec * local_f04 * local_f08;
  local_f70 = Mat::operator_cast_to_float_(&local_f60);
  for (local_f80 = 0; local_f80 < local_ef8; local_f80 = local_f80 + 1) {
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_fd0);
    Mat::~Mat((Mat *)0x1cef49);
    local_fd4 = local_f64 * local_f80;
    for (local_fd8 = 0; local_fd8 < local_ef0; local_fd8 = local_fd8 + 1) {
      for (local_fdc = 0; local_fdc < local_eec; local_fdc = local_fdc + 1) {
        for (local_fe0 = 0; local_fe0 < local_f08; local_fe0 = local_fe0 + 1) {
          for (local_fe4 = 0; local_fe4 < local_f04; local_fe4 = local_fe4 + 1) {
            local_fe8 = local_fd8 + local_fe0 * in_stack_00000010;
            local_fec = local_fdc + local_fe4 * in_stack_00000008;
            local_ff0 = local_fe8 * local_ef4 + local_fec;
            local_f70[local_fd4] = pfVar15[local_ff0];
            local_fd4 = local_fd4 + 1;
          }
        }
      }
    }
    local_f88 = pfVar15;
  }
  local_ff4 = local_eec * local_ef0;
  local_ff8 = local_f04 * local_f08;
  Mat::Mat(in_stack_ffffffffffffe650,(int)((ulong)in_stack_ffffffffffffe648 >> 0x20),
           (int)in_stack_ffffffffffffe648,(int)(in_stack_ffffffffffffe640 >> 0x20),
           (size_t)in_stack_ffffffffffffe638,(Allocator *)0x1cf1b7);
  local_1044 = local_ff8 >> 2;
  local_1048 = local_1044 << 2;
  for (local_104c = 0; local_104c < local_1044; local_104c = local_104c + 1) {
    local_1050 = local_104c << 2;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_10a0);
    Mat::~Mat((Mat *)0x1cf248);
    local_1058 = pfVar15 + local_1050;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_10f0);
    Mat::~Mat((Mat *)0x1cf2c3);
    local_10a8 = pfVar15;
    for (local_10f4 = 0; local_10f4 < local_ef8 * local_ff4; local_10f4 = local_10f4 + 1) {
      local_8 = local_10a8;
      local_940 = local_1058;
      local_18 = *(undefined8 *)local_1058;
      uStack_10 = *(undefined8 *)(local_1058 + 2);
      *(undefined8 *)local_10a8 = local_18;
      *(undefined8 *)(local_10a8 + 2) = uStack_10;
      local_10a8 = local_10a8 + 4;
      local_1058 = local_1058 + local_ff8;
    }
  }
  for (local_10f8 = local_1048; local_10f8 < local_ff8; local_10f8 = local_10f8 + 1) {
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_1148);
    Mat::~Mat((Mat *)0x1cf469);
    local_1100 = pfVar15 + local_10f8;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_1198);
    Mat::~Mat((Mat *)0x1cf4ef);
    local_1150 = pfVar15;
    for (local_119c = 0; local_119c < local_ef8 * local_ff4; local_119c = local_119c + 1) {
      *local_1150 = *local_1100;
      local_1150 = local_1150 + 1;
      local_1100 = local_1100 + local_ff8;
    }
  }
  local_11a0 = local_f04 * local_f08;
  local_11a4 = local_eec * local_ef0 * local_ef8;
  local_11a8 = local_f0c >> 2;
  local_11ac = local_11a8 << 2;
  for (local_11b0 = 0; local_11b0 < local_11a8; local_11b0 = local_11b0 + 1) {
    local_11b4 = local_11b0 << 2;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_1208);
    Mat::~Mat((Mat *)0x1cf6c7);
    local_11c0 = pfVar15;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_1258);
    Mat::~Mat((Mat *)0x1cf715);
    local_1210 = pfVar15;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_12a8);
    Mat::~Mat((Mat *)0x1cf764);
    local_1260 = pfVar15;
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    pfVar15 = Mat::operator_cast_to_float_(&local_12f8);
    Mat::~Mat((Mat *)0x1cf7b3);
    local_12b0 = pfVar15;
    memset(local_1308,0,0x10);
    if (local_f18 == (float *)0x0) {
      local_1970 = local_1308;
    }
    else {
      local_1970 = local_f18 + local_11b4;
    }
    local_1310 = local_1970;
    for (local_1314 = 0; local_1314 + 3 < local_11a0; local_1314 = local_1314 + 4) {
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_1368);
      Mat::~Mat((Mat *)0x1cf885);
      local_1320 = pfVar15;
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_13b8);
      Mat::~Mat((Mat *)0x1cf8de);
      local_9e8 = *local_1310;
      local_13c8 = CONCAT44(local_9e8,local_9e8);
      uStack_13c0 = CONCAT44(local_9e8,local_9e8);
      local_a08 = local_1310[1];
      local_13d8 = CONCAT44(local_a08,local_a08);
      uStack_13d0 = CONCAT44(local_a08,local_a08);
      local_a28 = local_1310[2];
      local_13e8 = CONCAT44(local_a28,local_a28);
      uStack_13e0 = CONCAT44(local_a28,local_a28);
      local_a48 = local_1310[3];
      local_13f8 = CONCAT44(local_a48,local_a48);
      uStack_13f0 = CONCAT44(local_a48,local_a48);
      local_1370 = pfVar15;
      for (local_13fc = 0; local_13fc + 3 < local_11a4; local_13fc = local_13fc + 4) {
        local_948 = local_1320;
        local_168 = *(undefined8 *)local_1320;
        uStack_160 = *(undefined8 *)(local_1320 + 2);
        local_a68 = *local_1370;
        local_118 = CONCAT44(local_a68,local_a68);
        uStack_110 = CONCAT44(local_a68,local_a68);
        local_a88 = local_1370[1];
        local_138 = CONCAT44(local_a88,local_a88);
        uStack_130 = CONCAT44(local_a88,local_a88);
        local_aa8 = local_1370[2];
        local_158 = CONCAT44(local_aa8,local_aa8);
        uStack_150 = CONCAT44(local_aa8,local_aa8);
        local_ac8 = local_1370[3];
        local_178 = CONCAT44(local_ac8,local_ac8);
        uStack_170 = CONCAT44(local_ac8,local_ac8);
        uVar1 = local_13c8;
        uVar2 = uStack_13c0;
        local_108._0_4_ = (float)local_168;
        local_108._4_4_ = (float)((ulong)local_168 >> 0x20);
        uStack_100._0_4_ = (float)uStack_160;
        uStack_100._4_4_ = (float)((ulong)uStack_160 >> 0x20);
        local_4f8 = (float)local_108 * local_a68;
        fStack_4f4 = local_108._4_4_ * local_a68;
        fStack_4f0 = (float)uStack_100 * local_a68;
        fStack_4ec = uStack_100._4_4_ * local_a68;
        local_4e8._0_4_ = (float)local_13c8;
        local_4e8._4_4_ = (float)((ulong)local_13c8 >> 0x20);
        uStack_4e0._0_4_ = (float)uStack_13c0;
        uStack_4e0._4_4_ = (float)((ulong)uStack_13c0 >> 0x20);
        local_13c8 = CONCAT44(local_4e8._4_4_ + fStack_4f4,(float)local_4e8 + local_4f8);
        uStack_13c0 = CONCAT44(uStack_4e0._4_4_ + fStack_4ec,(float)uStack_4e0 + fStack_4f0);
        uVar3 = local_13d8;
        uVar4 = uStack_13d0;
        local_518 = (float)local_108 * local_a88;
        fStack_514 = local_108._4_4_ * local_a88;
        fStack_510 = (float)uStack_100 * local_a88;
        fStack_50c = uStack_100._4_4_ * local_a88;
        local_508._0_4_ = (float)local_13d8;
        local_508._4_4_ = (float)((ulong)local_13d8 >> 0x20);
        uStack_500._0_4_ = (float)uStack_13d0;
        uStack_500._4_4_ = (float)((ulong)uStack_13d0 >> 0x20);
        local_13d8 = CONCAT44(local_508._4_4_ + fStack_514,(float)local_508 + local_518);
        uStack_13d0 = CONCAT44(uStack_500._4_4_ + fStack_50c,(float)uStack_500 + fStack_510);
        uVar5 = local_13e8;
        uVar6 = uStack_13e0;
        local_538 = (float)local_108 * local_aa8;
        fStack_534 = local_108._4_4_ * local_aa8;
        fStack_530 = (float)uStack_100 * local_aa8;
        fStack_52c = uStack_100._4_4_ * local_aa8;
        local_528._0_4_ = (float)local_13e8;
        local_528._4_4_ = (float)((ulong)local_13e8 >> 0x20);
        uStack_520._0_4_ = (float)uStack_13e0;
        uStack_520._4_4_ = (float)((ulong)uStack_13e0 >> 0x20);
        local_13e8 = CONCAT44(local_528._4_4_ + fStack_534,(float)local_528 + local_538);
        uStack_13e0 = CONCAT44(uStack_520._4_4_ + fStack_52c,(float)uStack_520 + fStack_530);
        uVar7 = local_13f8;
        uVar8 = uStack_13f0;
        local_558 = (float)local_108 * local_ac8;
        fStack_554 = local_108._4_4_ * local_ac8;
        fStack_550 = (float)uStack_100 * local_ac8;
        fStack_54c = uStack_100._4_4_ * local_ac8;
        local_548._0_4_ = (float)local_13f8;
        local_548._4_4_ = (float)((ulong)local_13f8 >> 0x20);
        uStack_540._0_4_ = (float)uStack_13f0;
        uStack_540._4_4_ = (float)((ulong)uStack_13f0 >> 0x20);
        local_13f8 = CONCAT44(local_548._4_4_ + fStack_554,(float)local_548 + local_558);
        uStack_13f0 = CONCAT44(uStack_540._4_4_ + fStack_54c,(float)uStack_540 + fStack_550);
        local_950 = local_1320 + 4;
        local_1e8 = *(undefined8 *)local_950;
        uStack_1e0 = *(undefined8 *)(local_1320 + 6);
        local_ae8 = local_1370[4];
        local_198 = CONCAT44(local_ae8,local_ae8);
        uStack_190 = CONCAT44(local_ae8,local_ae8);
        local_b08 = local_1370[5];
        local_1b8 = CONCAT44(local_b08,local_b08);
        uStack_1b0 = CONCAT44(local_b08,local_b08);
        local_b28 = local_1370[6];
        local_1d8 = CONCAT44(local_b28,local_b28);
        uStack_1d0 = CONCAT44(local_b28,local_b28);
        local_b48 = local_1370[7];
        local_1f8 = CONCAT44(local_b48,local_b48);
        uStack_1f0 = CONCAT44(local_b48,local_b48);
        local_568 = local_13c8;
        uStack_560 = uStack_13c0;
        local_188._0_4_ = (float)local_1e8;
        local_188._4_4_ = (float)((ulong)local_1e8 >> 0x20);
        uStack_180._0_4_ = (float)uStack_1e0;
        uStack_180._4_4_ = (float)((ulong)uStack_1e0 >> 0x20);
        local_578 = (float)local_188 * local_ae8;
        fStack_574 = local_188._4_4_ * local_ae8;
        fStack_570 = (float)uStack_180 * local_ae8;
        fStack_56c = uStack_180._4_4_ * local_ae8;
        fVar16 = (float)local_4e8 + local_4f8 + local_578;
        fVar20 = local_4e8._4_4_ + fStack_4f4 + fStack_574;
        fVar24 = (float)uStack_4e0 + fStack_4f0 + fStack_570;
        fVar28 = uStack_4e0._4_4_ + fStack_4ec + fStack_56c;
        local_13c8 = CONCAT44(fVar20,fVar16);
        uStack_13c0 = CONCAT44(fVar28,fVar24);
        local_588 = local_13d8;
        uStack_580 = uStack_13d0;
        local_598 = (float)local_188 * local_b08;
        fStack_594 = local_188._4_4_ * local_b08;
        fStack_590 = (float)uStack_180 * local_b08;
        fStack_58c = uStack_180._4_4_ * local_b08;
        fVar17 = (float)local_508 + local_518 + local_598;
        fVar21 = local_508._4_4_ + fStack_514 + fStack_594;
        fVar25 = (float)uStack_500 + fStack_510 + fStack_590;
        fVar29 = uStack_500._4_4_ + fStack_50c + fStack_58c;
        local_13d8 = CONCAT44(fVar21,fVar17);
        uStack_13d0 = CONCAT44(fVar29,fVar25);
        local_5a8 = local_13e8;
        uStack_5a0 = uStack_13e0;
        local_5b8 = (float)local_188 * local_b28;
        fStack_5b4 = local_188._4_4_ * local_b28;
        fStack_5b0 = (float)uStack_180 * local_b28;
        fStack_5ac = uStack_180._4_4_ * local_b28;
        fVar18 = (float)local_528 + local_538 + local_5b8;
        fVar22 = local_528._4_4_ + fStack_534 + fStack_5b4;
        fVar26 = (float)uStack_520 + fStack_530 + fStack_5b0;
        fVar30 = uStack_520._4_4_ + fStack_52c + fStack_5ac;
        local_13e8 = CONCAT44(fVar22,fVar18);
        uStack_13e0 = CONCAT44(fVar30,fVar26);
        local_5c8 = local_13f8;
        uStack_5c0 = uStack_13f0;
        local_5d8 = (float)local_188 * local_b48;
        fStack_5d4 = local_188._4_4_ * local_b48;
        fStack_5d0 = (float)uStack_180 * local_b48;
        fStack_5cc = uStack_180._4_4_ * local_b48;
        fVar19 = (float)local_548 + local_558 + local_5d8;
        fVar23 = local_548._4_4_ + fStack_554 + fStack_5d4;
        fVar27 = (float)uStack_540 + fStack_550 + fStack_5d0;
        fVar31 = uStack_540._4_4_ + fStack_54c + fStack_5cc;
        local_13f8 = CONCAT44(fVar23,fVar19);
        uStack_13f0 = CONCAT44(fVar31,fVar27);
        local_958 = local_1320 + 8;
        local_268 = *(undefined8 *)local_958;
        uStack_260 = *(undefined8 *)(local_1320 + 10);
        local_b68 = local_1370[8];
        local_218 = CONCAT44(local_b68,local_b68);
        uStack_210 = CONCAT44(local_b68,local_b68);
        local_b88 = local_1370[9];
        local_238 = CONCAT44(local_b88,local_b88);
        uStack_230 = CONCAT44(local_b88,local_b88);
        local_ba8 = local_1370[10];
        local_258 = CONCAT44(local_ba8,local_ba8);
        uStack_250 = CONCAT44(local_ba8,local_ba8);
        local_bc8 = local_1370[0xb];
        local_278 = CONCAT44(local_bc8,local_bc8);
        uStack_270 = CONCAT44(local_bc8,local_bc8);
        local_5e8 = local_13c8;
        uStack_5e0 = uStack_13c0;
        local_208._0_4_ = (float)local_268;
        local_208._4_4_ = (float)((ulong)local_268 >> 0x20);
        uStack_200._0_4_ = (float)uStack_260;
        uStack_200._4_4_ = (float)((ulong)uStack_260 >> 0x20);
        local_5f8 = (float)local_208 * local_b68;
        fStack_5f4 = local_208._4_4_ * local_b68;
        fStack_5f0 = (float)uStack_200 * local_b68;
        fStack_5ec = uStack_200._4_4_ * local_b68;
        fVar16 = fVar16 + local_5f8;
        fVar20 = fVar20 + fStack_5f4;
        fVar24 = fVar24 + fStack_5f0;
        fVar28 = fVar28 + fStack_5ec;
        local_13c8 = CONCAT44(fVar20,fVar16);
        uStack_13c0 = CONCAT44(fVar28,fVar24);
        local_608 = local_13d8;
        uStack_600 = uStack_13d0;
        local_618 = (float)local_208 * local_b88;
        fStack_614 = local_208._4_4_ * local_b88;
        fStack_610 = (float)uStack_200 * local_b88;
        fStack_60c = uStack_200._4_4_ * local_b88;
        fVar17 = fVar17 + local_618;
        fVar21 = fVar21 + fStack_614;
        fVar25 = fVar25 + fStack_610;
        fVar29 = fVar29 + fStack_60c;
        local_13d8 = CONCAT44(fVar21,fVar17);
        uStack_13d0 = CONCAT44(fVar29,fVar25);
        local_628 = local_13e8;
        uStack_620 = uStack_13e0;
        local_638 = (float)local_208 * local_ba8;
        fStack_634 = local_208._4_4_ * local_ba8;
        fStack_630 = (float)uStack_200 * local_ba8;
        fStack_62c = uStack_200._4_4_ * local_ba8;
        fVar18 = fVar18 + local_638;
        fVar22 = fVar22 + fStack_634;
        fVar26 = fVar26 + fStack_630;
        fVar30 = fVar30 + fStack_62c;
        local_13e8 = CONCAT44(fVar22,fVar18);
        uStack_13e0 = CONCAT44(fVar30,fVar26);
        local_648 = local_13f8;
        uStack_640 = uStack_13f0;
        local_658 = (float)local_208 * local_bc8;
        fStack_654 = local_208._4_4_ * local_bc8;
        fStack_650 = (float)uStack_200 * local_bc8;
        fStack_64c = uStack_200._4_4_ * local_bc8;
        fVar19 = fVar19 + local_658;
        fVar23 = fVar23 + fStack_654;
        fVar27 = fVar27 + fStack_650;
        fVar31 = fVar31 + fStack_64c;
        local_13f8 = CONCAT44(fVar23,fVar19);
        uStack_13f0 = CONCAT44(fVar31,fVar27);
        local_960 = local_1320 + 0xc;
        local_1418 = *(undefined8 *)local_960;
        uStack_1410 = *(undefined8 *)(local_1320 + 0xe);
        local_be8 = local_1370[0xc];
        local_1428 = CONCAT44(local_be8,local_be8);
        uStack_1420 = CONCAT44(local_be8,local_be8);
        local_c08 = local_1370[0xd];
        local_1438 = CONCAT44(local_c08,local_c08);
        uStack_1430 = CONCAT44(local_c08,local_c08);
        local_c28 = local_1370[0xe];
        local_1448 = CONCAT44(local_c28,local_c28);
        uStack_1440 = CONCAT44(local_c28,local_c28);
        local_c48 = local_1370[0xf];
        local_1458 = CONCAT44(local_c48,local_c48);
        uStack_1450 = CONCAT44(local_c48,local_c48);
        local_668 = local_13c8;
        uStack_660 = uStack_13c0;
        local_288._0_4_ = (float)local_1418;
        local_288._4_4_ = (float)((ulong)local_1418 >> 0x20);
        uStack_280._0_4_ = (float)uStack_1410;
        uStack_280._4_4_ = (float)((ulong)uStack_1410 >> 0x20);
        local_678 = (float)local_288 * local_be8;
        fStack_674 = local_288._4_4_ * local_be8;
        fStack_670 = (float)uStack_280 * local_be8;
        fStack_66c = uStack_280._4_4_ * local_be8;
        local_13c8 = CONCAT44(fVar20 + fStack_674,fVar16 + local_678);
        uStack_13c0 = CONCAT44(fVar28 + fStack_66c,fVar24 + fStack_670);
        local_688 = local_13d8;
        uStack_680 = uStack_13d0;
        local_698 = (float)local_288 * local_c08;
        fStack_694 = local_288._4_4_ * local_c08;
        fStack_690 = (float)uStack_280 * local_c08;
        fStack_68c = uStack_280._4_4_ * local_c08;
        local_13d8 = CONCAT44(fVar21 + fStack_694,fVar17 + local_698);
        uStack_13d0 = CONCAT44(fVar29 + fStack_68c,fVar25 + fStack_690);
        local_6a8 = local_13e8;
        uStack_6a0 = uStack_13e0;
        local_6b8 = (float)local_288 * local_c28;
        fStack_6b4 = local_288._4_4_ * local_c28;
        fStack_6b0 = (float)uStack_280 * local_c28;
        fStack_6ac = uStack_280._4_4_ * local_c28;
        local_13e8 = CONCAT44(fVar22 + fStack_6b4,fVar18 + local_6b8);
        uStack_13e0 = CONCAT44(fVar30 + fStack_6ac,fVar26 + fStack_6b0);
        local_6c8 = local_13f8;
        uStack_6c0 = uStack_13f0;
        local_6d8 = (float)local_288 * local_c48;
        fStack_6d4 = local_288._4_4_ * local_c48;
        fStack_6d0 = (float)uStack_280 * local_c48;
        fStack_6cc = uStack_280._4_4_ * local_c48;
        local_13f8 = CONCAT44(fVar23 + fStack_6d4,fVar19 + local_6d8);
        uStack_13f0 = CONCAT44(fVar31 + fStack_6cc,fVar27 + fStack_6d0);
        local_1370 = local_1370 + 0x10;
        local_1320 = local_1320 + 0x10;
        fStack_c44 = local_c48;
        fStack_c40 = local_c48;
        fStack_c3c = local_c48;
        local_c38 = local_c48;
        fStack_c24 = local_c28;
        fStack_c20 = local_c28;
        fStack_c1c = local_c28;
        local_c0c = local_c28;
        fStack_c04 = local_c08;
        fStack_c00 = local_c08;
        fStack_bfc = local_c08;
        local_bec = local_c08;
        fStack_be4 = local_be8;
        fStack_be0 = local_be8;
        fStack_bdc = local_be8;
        local_bcc = local_be8;
        fStack_bc4 = local_bc8;
        fStack_bc0 = local_bc8;
        fStack_bbc = local_bc8;
        local_bac = local_bc8;
        fStack_ba4 = local_ba8;
        fStack_ba0 = local_ba8;
        fStack_b9c = local_ba8;
        local_b8c = local_ba8;
        fStack_b84 = local_b88;
        fStack_b80 = local_b88;
        fStack_b7c = local_b88;
        local_b6c = local_b88;
        fStack_b64 = local_b68;
        fStack_b60 = local_b68;
        fStack_b5c = local_b68;
        local_b4c = local_b68;
        fStack_b44 = local_b48;
        fStack_b40 = local_b48;
        fStack_b3c = local_b48;
        local_b2c = local_b48;
        fStack_b24 = local_b28;
        fStack_b20 = local_b28;
        fStack_b1c = local_b28;
        local_b0c = local_b28;
        fStack_b04 = local_b08;
        fStack_b00 = local_b08;
        fStack_afc = local_b08;
        local_aec = local_b08;
        fStack_ae4 = local_ae8;
        fStack_ae0 = local_ae8;
        fStack_adc = local_ae8;
        local_acc = local_ae8;
        fStack_ac4 = local_ac8;
        fStack_ac0 = local_ac8;
        fStack_abc = local_ac8;
        local_aac = local_ac8;
        fStack_aa4 = local_aa8;
        fStack_aa0 = local_aa8;
        fStack_a9c = local_aa8;
        local_a8c = local_aa8;
        fStack_a84 = local_a88;
        fStack_a80 = local_a88;
        fStack_a7c = local_a88;
        local_a6c = local_a88;
        fStack_a64 = local_a68;
        fStack_a60 = local_a68;
        fStack_a5c = local_a68;
        local_a4c = local_a68;
        local_548 = uVar7;
        uStack_540 = uVar8;
        local_528 = uVar5;
        uStack_520 = uVar6;
        local_508 = uVar3;
        uStack_500 = uVar4;
        local_4e8 = uVar1;
        uStack_4e0 = uVar2;
        local_2f8 = local_1458;
        uStack_2f0 = uStack_1450;
        local_2e8 = local_1418;
        uStack_2e0 = uStack_1410;
        local_2d8 = local_1448;
        uStack_2d0 = uStack_1440;
        local_2c8 = local_1418;
        uStack_2c0 = uStack_1410;
        local_2b8 = local_1438;
        uStack_2b0 = uStack_1430;
        local_2a8 = local_1418;
        uStack_2a0 = uStack_1410;
        local_298 = local_1428;
        uStack_290 = uStack_1420;
        local_288 = local_1418;
        uStack_280 = uStack_1410;
        local_248 = local_268;
        uStack_240 = uStack_260;
        local_228 = local_268;
        uStack_220 = uStack_260;
        local_208 = local_268;
        uStack_200 = uStack_260;
        local_1c8 = local_1e8;
        uStack_1c0 = uStack_1e0;
        local_1a8 = local_1e8;
        uStack_1a0 = uStack_1e0;
        local_188 = local_1e8;
        uStack_180 = uStack_1e0;
        local_148 = local_168;
        uStack_140 = uStack_160;
        local_128 = local_168;
        uStack_120 = uStack_160;
        local_108 = local_168;
        uStack_100 = uStack_160;
      }
      for (; local_13fc < local_11a4; local_13fc = local_13fc + 1) {
        local_968 = local_1320;
        local_1468 = *(undefined8 *)local_1320;
        uStack_1460 = *(undefined8 *)(local_1320 + 2);
        local_c68 = *local_1370;
        local_1478 = CONCAT44(local_c68,local_c68);
        uStack_1470 = CONCAT44(local_c68,local_c68);
        local_c88 = local_1370[1];
        local_1488 = CONCAT44(local_c88,local_c88);
        uStack_1480 = CONCAT44(local_c88,local_c88);
        local_ca8 = local_1370[2];
        local_1498 = CONCAT44(local_ca8,local_ca8);
        uStack_1490 = CONCAT44(local_ca8,local_ca8);
        local_cc8 = local_1370[3];
        local_14a8 = CONCAT44(local_cc8,local_cc8);
        uStack_14a0 = CONCAT44(local_cc8,local_cc8);
        uVar1 = local_13c8;
        uVar2 = uStack_13c0;
        local_308._0_4_ = (float)local_1468;
        local_308._4_4_ = (float)((ulong)local_1468 >> 0x20);
        uStack_300._0_4_ = (float)uStack_1460;
        uStack_300._4_4_ = (float)((ulong)uStack_1460 >> 0x20);
        local_6f8 = (float)local_308 * local_c68;
        fStack_6f4 = local_308._4_4_ * local_c68;
        fStack_6f0 = (float)uStack_300 * local_c68;
        fStack_6ec = uStack_300._4_4_ * local_c68;
        local_6e8._0_4_ = (float)local_13c8;
        local_6e8._4_4_ = (float)((ulong)local_13c8 >> 0x20);
        uStack_6e0._0_4_ = (float)uStack_13c0;
        uStack_6e0._4_4_ = (float)((ulong)uStack_13c0 >> 0x20);
        local_13c8 = CONCAT44(local_6e8._4_4_ + fStack_6f4,(float)local_6e8 + local_6f8);
        uStack_13c0 = CONCAT44(uStack_6e0._4_4_ + fStack_6ec,(float)uStack_6e0 + fStack_6f0);
        uVar3 = local_13d8;
        uVar4 = uStack_13d0;
        local_718 = (float)local_308 * local_c88;
        fStack_714 = local_308._4_4_ * local_c88;
        fStack_710 = (float)uStack_300 * local_c88;
        fStack_70c = uStack_300._4_4_ * local_c88;
        local_708._0_4_ = (float)local_13d8;
        local_708._4_4_ = (float)((ulong)local_13d8 >> 0x20);
        uStack_700._0_4_ = (float)uStack_13d0;
        uStack_700._4_4_ = (float)((ulong)uStack_13d0 >> 0x20);
        local_13d8 = CONCAT44(local_708._4_4_ + fStack_714,(float)local_708 + local_718);
        uStack_13d0 = CONCAT44(uStack_700._4_4_ + fStack_70c,(float)uStack_700 + fStack_710);
        uVar5 = local_13e8;
        uVar6 = uStack_13e0;
        local_738 = (float)local_308 * local_ca8;
        fStack_734 = local_308._4_4_ * local_ca8;
        fStack_730 = (float)uStack_300 * local_ca8;
        fStack_72c = uStack_300._4_4_ * local_ca8;
        local_728._0_4_ = (float)local_13e8;
        local_728._4_4_ = (float)((ulong)local_13e8 >> 0x20);
        uStack_720._0_4_ = (float)uStack_13e0;
        uStack_720._4_4_ = (float)((ulong)uStack_13e0 >> 0x20);
        local_13e8 = CONCAT44(local_728._4_4_ + fStack_734,(float)local_728 + local_738);
        uStack_13e0 = CONCAT44(uStack_720._4_4_ + fStack_72c,(float)uStack_720 + fStack_730);
        uVar7 = local_13f8;
        uVar8 = uStack_13f0;
        local_758 = (float)local_308 * local_cc8;
        fStack_754 = local_308._4_4_ * local_cc8;
        fStack_750 = (float)uStack_300 * local_cc8;
        fStack_74c = uStack_300._4_4_ * local_cc8;
        local_748._0_4_ = (float)local_13f8;
        local_748._4_4_ = (float)((ulong)local_13f8 >> 0x20);
        uStack_740._0_4_ = (float)uStack_13f0;
        uStack_740._4_4_ = (float)((ulong)uStack_13f0 >> 0x20);
        local_13f8 = CONCAT44(local_748._4_4_ + fStack_754,(float)local_748 + local_758);
        uStack_13f0 = CONCAT44(uStack_740._4_4_ + fStack_74c,(float)uStack_740 + fStack_750);
        local_1370 = local_1370 + 4;
        local_1320 = local_1320 + 4;
        fStack_cc4 = local_cc8;
        fStack_cc0 = local_cc8;
        fStack_cbc = local_cc8;
        local_cb8 = local_cc8;
        fStack_ca4 = local_ca8;
        fStack_ca0 = local_ca8;
        fStack_c9c = local_ca8;
        local_c8c = local_ca8;
        fStack_c84 = local_c88;
        fStack_c80 = local_c88;
        fStack_c7c = local_c88;
        local_c6c = local_c88;
        fStack_c64 = local_c68;
        fStack_c60 = local_c68;
        fStack_c5c = local_c68;
        local_c4c = local_c68;
        local_748 = uVar7;
        uStack_740 = uVar8;
        local_728 = uVar5;
        uStack_720 = uVar6;
        local_708 = uVar3;
        uStack_700 = uVar4;
        local_6e8 = uVar1;
        uStack_6e0 = uVar2;
        local_378 = local_14a8;
        uStack_370 = uStack_14a0;
        local_368 = local_1468;
        uStack_360 = uStack_1460;
        local_358 = local_1498;
        uStack_350 = uStack_1490;
        local_348 = local_1468;
        uStack_340 = uStack_1460;
        local_338 = local_1488;
        uStack_330 = uStack_1480;
        local_328 = local_1468;
        uStack_320 = uStack_1460;
        local_318 = local_1478;
        uStack_310 = uStack_1470;
        local_308 = local_1468;
        uStack_300 = uStack_1460;
      }
      local_20 = local_11c0;
      local_38 = local_13c8;
      uStack_30 = uStack_13c0;
      *(undefined8 *)local_11c0 = local_13c8;
      *(undefined8 *)(local_11c0 + 2) = uStack_13c0;
      local_40 = local_1210;
      local_58 = local_13d8;
      uStack_50 = uStack_13d0;
      *(undefined8 *)local_1210 = local_13d8;
      *(undefined8 *)(local_1210 + 2) = uStack_13d0;
      local_60 = local_1260;
      local_78 = local_13e8;
      uStack_70 = uStack_13e0;
      *(undefined8 *)local_1260 = local_13e8;
      *(undefined8 *)(local_1260 + 2) = uStack_13e0;
      local_80 = local_12b0;
      local_98 = local_13f8;
      uStack_90 = uStack_13f0;
      *(undefined8 *)local_12b0 = local_13f8;
      *(undefined8 *)(local_12b0 + 2) = uStack_13f0;
      local_11c0 = local_11c0 + 4;
      local_1210 = local_1210 + 4;
      local_1260 = local_1260 + 4;
      local_12b0 = local_12b0 + 4;
      fStack_a44 = local_a48;
      fStack_a40 = local_a48;
      fStack_a3c = local_a48;
      local_a38 = local_a48;
      fStack_a24 = local_a28;
      fStack_a20 = local_a28;
      fStack_a1c = local_a28;
      local_a0c = local_a28;
      fStack_a04 = local_a08;
      fStack_a00 = local_a08;
      fStack_9fc = local_a08;
      local_9ec = local_a08;
      fStack_9e4 = local_9e8;
      fStack_9e0 = local_9e8;
      fStack_9dc = local_9e8;
      local_9d4 = local_9e8;
    }
    for (; local_1314 < local_11a0; local_1314 = local_1314 + 1) {
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_14f8);
      Mat::~Mat((Mat *)0x1d0a27);
      local_14b0 = pfVar15;
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_1548);
      Mat::~Mat((Mat *)0x1d0a80);
      local_970 = local_1310;
      uVar1 = *(undefined8 *)local_1310;
      uVar2 = *(undefined8 *)(local_1310 + 2);
      local_ccc = 0;
      local_ce8 = 0;
      uStack_ce4 = 0;
      uStack_ce0 = 0;
      uStack_cdc = 0;
      local_1568 = 0;
      uStack_1560 = 0;
      local_cec = 0;
      local_d08 = 0;
      uStack_d04 = 0;
      uStack_d00 = 0;
      uStack_cfc = 0;
      local_1578 = 0;
      uStack_1570 = 0;
      local_d0c = 0;
      local_d28 = 0;
      uStack_d24 = 0;
      uStack_d20 = 0;
      uStack_d1c = 0;
      local_1588 = 0;
      uStack_1580 = 0;
      local_d38 = 0;
      local_d48 = 0;
      uStack_d44 = 0;
      uStack_d40 = 0;
      uStack_d3c = 0;
      local_1598 = 0;
      uStack_1590 = 0;
      local_159c = 0;
      local_1500 = pfVar15;
      while( true ) {
        uVar10 = uStack_760;
        uVar9 = local_768;
        uVar8 = uStack_780;
        uVar7 = local_788;
        uVar6 = uStack_7a0;
        uVar5 = local_7a8;
        uVar4 = uStack_7c0;
        uVar3 = local_7c8;
        local_768._0_4_ = (float)local_1568;
        local_768._4_4_ = (float)((ulong)local_1568 >> 0x20);
        uStack_760._0_4_ = (float)uStack_1560;
        uStack_760._4_4_ = (float)((ulong)uStack_1560 >> 0x20);
        local_788._0_4_ = (float)local_1578;
        local_788._4_4_ = (float)((ulong)local_1578 >> 0x20);
        uStack_780._0_4_ = (float)uStack_1570;
        uStack_780._4_4_ = (float)((ulong)uStack_1570 >> 0x20);
        local_7a8._0_4_ = (float)local_1588;
        local_7a8._4_4_ = (float)((ulong)local_1588 >> 0x20);
        uStack_7a0._0_4_ = (float)uStack_1580;
        uStack_7a0._4_4_ = (float)((ulong)uStack_1580 >> 0x20);
        local_7c8._0_4_ = (float)local_1598;
        local_7c8._4_4_ = (float)((ulong)local_1598 >> 0x20);
        uStack_7c0._0_4_ = (float)uStack_1590;
        uStack_7c0._4_4_ = (float)((ulong)uStack_1590 >> 0x20);
        if (local_11a4 <= local_159c + 3) break;
        local_d68 = *local_14b0;
        local_15b8 = CONCAT44(local_d68,local_d68);
        uStack_15b0 = CONCAT44(local_d68,local_d68);
        local_d88 = local_14b0[1];
        local_15c8 = CONCAT44(local_d88,local_d88);
        uStack_15c0 = CONCAT44(local_d88,local_d88);
        local_da8 = local_14b0[2];
        local_15d8 = CONCAT44(local_da8,local_da8);
        uStack_15d0 = CONCAT44(local_da8,local_da8);
        local_dc8 = local_14b0[3];
        local_15e8 = CONCAT44(local_dc8,local_dc8);
        uStack_15e0 = CONCAT44(local_dc8,local_dc8);
        local_978 = local_1500;
        local_15f8 = *(undefined8 *)local_1500;
        uStack_15f0 = *(undefined8 *)(local_1500 + 2);
        local_980 = local_1500 + 4;
        local_1608 = *(undefined8 *)local_980;
        uStack_1600 = *(undefined8 *)(local_1500 + 6);
        local_988 = local_1500 + 8;
        local_1618 = *(undefined8 *)local_988;
        uStack_1610 = *(undefined8 *)(local_1500 + 10);
        local_990 = local_1500 + 0xc;
        local_1628 = *(undefined8 *)local_990;
        uStack_1620 = *(undefined8 *)(local_1500 + 0xe);
        uVar3 = local_1568;
        uVar4 = uStack_1560;
        local_388._0_4_ = (float)local_15f8;
        local_388._4_4_ = (float)((ulong)local_15f8 >> 0x20);
        uStack_380._0_4_ = (float)uStack_15f0;
        uStack_380._4_4_ = (float)((ulong)uStack_15f0 >> 0x20);
        local_778 = (float)local_388 * local_d68;
        fStack_774 = local_388._4_4_ * local_d68;
        fStack_770 = (float)uStack_380 * local_d68;
        fStack_76c = uStack_380._4_4_ * local_d68;
        local_1568 = CONCAT44(local_768._4_4_ + fStack_774,(float)local_768 + local_778);
        uStack_1560 = CONCAT44(uStack_760._4_4_ + fStack_76c,(float)uStack_760 + fStack_770);
        uVar5 = local_1578;
        uVar6 = uStack_1570;
        local_3a8._0_4_ = (float)local_1608;
        local_3a8._4_4_ = (float)((ulong)local_1608 >> 0x20);
        uStack_3a0._0_4_ = (float)uStack_1600;
        uStack_3a0._4_4_ = (float)((ulong)uStack_1600 >> 0x20);
        local_798 = (float)local_3a8 * local_d88;
        fStack_794 = local_3a8._4_4_ * local_d88;
        fStack_790 = (float)uStack_3a0 * local_d88;
        fStack_78c = uStack_3a0._4_4_ * local_d88;
        local_1578 = CONCAT44(local_788._4_4_ + fStack_794,(float)local_788 + local_798);
        uStack_1570 = CONCAT44(uStack_780._4_4_ + fStack_78c,(float)uStack_780 + fStack_790);
        uVar7 = local_1588;
        uVar8 = uStack_1580;
        local_3c8._0_4_ = (float)local_1618;
        local_3c8._4_4_ = (float)((ulong)local_1618 >> 0x20);
        uStack_3c0._0_4_ = (float)uStack_1610;
        uStack_3c0._4_4_ = (float)((ulong)uStack_1610 >> 0x20);
        local_7b8 = (float)local_3c8 * local_da8;
        fStack_7b4 = local_3c8._4_4_ * local_da8;
        fStack_7b0 = (float)uStack_3c0 * local_da8;
        fStack_7ac = uStack_3c0._4_4_ * local_da8;
        local_1588 = CONCAT44(local_7a8._4_4_ + fStack_7b4,(float)local_7a8 + local_7b8);
        uStack_1580 = CONCAT44(uStack_7a0._4_4_ + fStack_7ac,(float)uStack_7a0 + fStack_7b0);
        uVar9 = local_1598;
        uVar10 = uStack_1590;
        local_3e8._0_4_ = (float)local_1628;
        local_3e8._4_4_ = (float)((ulong)local_1628 >> 0x20);
        uStack_3e0._0_4_ = (float)uStack_1620;
        uStack_3e0._4_4_ = (float)((ulong)uStack_1620 >> 0x20);
        local_7d8 = (float)local_3e8 * local_dc8;
        fStack_7d4 = local_3e8._4_4_ * local_dc8;
        fStack_7d0 = (float)uStack_3e0 * local_dc8;
        fStack_7cc = uStack_3e0._4_4_ * local_dc8;
        local_1598 = CONCAT44(local_7c8._4_4_ + fStack_7d4,(float)local_7c8 + local_7d8);
        uStack_1590 = CONCAT44(uStack_7c0._4_4_ + fStack_7cc,(float)uStack_7c0 + fStack_7d0);
        local_1500 = local_1500 + 0x10;
        local_14b0 = local_14b0 + 4;
        local_159c = local_159c + 4;
        fStack_dc4 = local_dc8;
        fStack_dc0 = local_dc8;
        fStack_dbc = local_dc8;
        local_db8 = local_dc8;
        fStack_da4 = local_da8;
        fStack_da0 = local_da8;
        fStack_d9c = local_da8;
        local_d8c = local_da8;
        fStack_d84 = local_d88;
        fStack_d80 = local_d88;
        fStack_d7c = local_d88;
        local_d6c = local_d88;
        fStack_d64 = local_d68;
        fStack_d60 = local_d68;
        fStack_d5c = local_d68;
        local_d4c = local_d68;
        local_7c8 = uVar9;
        uStack_7c0 = uVar10;
        local_7a8 = uVar7;
        uStack_7a0 = uVar8;
        local_788 = uVar5;
        uStack_780 = uVar6;
        local_768 = uVar3;
        uStack_760 = uVar4;
        local_3f8 = local_15e8;
        uStack_3f0 = uStack_15e0;
        local_3e8 = local_1628;
        uStack_3e0 = uStack_1620;
        local_3d8 = local_15d8;
        uStack_3d0 = uStack_15d0;
        local_3c8 = local_1618;
        uStack_3c0 = uStack_1610;
        local_3b8 = local_15c8;
        uStack_3b0 = uStack_15c0;
        local_3a8 = local_1608;
        uStack_3a0 = uStack_1600;
        local_398 = local_15b8;
        uStack_390 = uStack_15b0;
        local_388 = local_15f8;
        uStack_380 = uStack_15f0;
      }
      local_7e8 = local_1568;
      uStack_7e0 = uStack_1560;
      local_7f8 = local_1578;
      uStack_7f0 = uStack_1570;
      local_1568 = CONCAT44(local_768._4_4_ + local_788._4_4_,(float)local_768 + (float)local_788);
      uStack_1560 = CONCAT44(uStack_760._4_4_ + uStack_780._4_4_,
                             (float)uStack_760 + (float)uStack_780);
      local_808 = local_1588;
      uStack_800 = uStack_1580;
      local_818 = local_1598;
      uStack_810 = uStack_1590;
      local_1588 = CONCAT44(local_7a8._4_4_ + local_7c8._4_4_,(float)local_7a8 + (float)local_7c8);
      uStack_1580 = CONCAT44(uStack_7a0._4_4_ + uStack_7c0._4_4_,
                             (float)uStack_7a0 + (float)uStack_7c0);
      local_838 = local_1568;
      uStack_830 = uStack_1560;
      local_828._0_4_ = (float)uVar1;
      local_828._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_820._0_4_ = (float)uVar2;
      uStack_820._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_828._0_4_ = (float)local_828 + (float)local_768 + (float)local_788;
      local_828._4_4_ = local_828._4_4_ + local_768._4_4_ + local_788._4_4_;
      uStack_820._0_4_ = (float)uStack_820 + (float)uStack_760 + (float)uStack_780;
      uStack_820._4_4_ = uStack_820._4_4_ + uStack_760._4_4_ + uStack_780._4_4_;
      local_1558 = CONCAT44(local_828._4_4_,(float)local_828);
      uStack_1550 = CONCAT44(uStack_820._4_4_,(float)uStack_820);
      local_848 = local_1558;
      uStack_840 = uStack_1550;
      local_858 = local_1588;
      uStack_850 = uStack_1580;
      local_1558 = CONCAT44(local_828._4_4_ + local_7a8._4_4_ + local_7c8._4_4_,
                            (float)local_828 + (float)local_7a8 + (float)local_7c8);
      uStack_1550 = CONCAT44(uStack_820._4_4_ + uStack_7a0._4_4_ + uStack_7c0._4_4_,
                             (float)uStack_820 + (float)uStack_7a0 + (float)uStack_7c0);
      while( true ) {
        uVar12 = uStack_860;
        uVar11 = local_868;
        local_868._0_4_ = (float)local_1558;
        local_868._4_4_ = (float)((ulong)local_1558 >> 0x20);
        uStack_860._0_4_ = (float)uStack_1550;
        uStack_860._4_4_ = (float)((ulong)uStack_1550 >> 0x20);
        if (local_11a4 <= local_159c) break;
        local_de8 = *local_14b0;
        local_1638 = CONCAT44(local_de8,local_de8);
        uStack_1630 = CONCAT44(local_de8,local_de8);
        local_998 = local_1500;
        local_1648 = *(undefined8 *)local_1500;
        uStack_1640 = *(undefined8 *)(local_1500 + 2);
        uVar11 = local_1558;
        uVar12 = uStack_1550;
        local_408._0_4_ = (float)local_1648;
        local_408._4_4_ = (float)((ulong)local_1648 >> 0x20);
        uStack_400._0_4_ = (float)uStack_1640;
        uStack_400._4_4_ = (float)((ulong)uStack_1640 >> 0x20);
        local_878 = (float)local_408 * local_de8;
        fStack_874 = local_408._4_4_ * local_de8;
        fStack_870 = (float)uStack_400 * local_de8;
        fStack_86c = uStack_400._4_4_ * local_de8;
        local_1558 = CONCAT44(local_868._4_4_ + fStack_874,(float)local_868 + local_878);
        uStack_1550 = CONCAT44(uStack_860._4_4_ + fStack_86c,(float)uStack_860 + fStack_870);
        local_1500 = local_1500 + 4;
        local_14b0 = local_14b0 + 1;
        local_159c = local_159c + 1;
        fStack_de4 = local_de8;
        fStack_de0 = local_de8;
        fStack_ddc = local_de8;
        local_dd8 = local_de8;
        local_868 = uVar11;
        uStack_860 = uVar12;
        local_418 = local_1638;
        uStack_410 = uStack_1630;
        local_408 = local_1648;
        uStack_400 = uStack_1640;
      }
      local_a0 = local_1658;
      local_b8 = local_1558;
      uStack_b0 = uStack_1550;
      *local_11c0 = (float)local_868;
      *local_1210 = local_868._4_4_;
      *local_1260 = (float)uStack_860;
      *local_12b0 = uStack_860._4_4_;
      local_11c0 = local_11c0 + 1;
      local_1210 = local_1210 + 1;
      local_1260 = local_1260 + 1;
      local_12b0 = local_12b0 + 1;
      local_868 = uVar11;
      uStack_860 = uVar12;
      local_828 = uVar1;
      uStack_820 = uVar2;
      local_7c8 = uVar3;
      uStack_7c0 = uVar4;
      local_7a8 = uVar5;
      uStack_7a0 = uVar6;
      local_788 = uVar7;
      uStack_780 = uVar8;
      local_768 = uVar9;
      uStack_760 = uVar10;
    }
  }
  for (local_165c = local_11ac; local_165c < local_f0c; local_165c = local_165c + 1) {
    Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
    in_stack_ffffffffffffe668 = (Mat *)Mat::operator_cast_to_float_(&local_16b0);
    Mat::~Mat((Mat *)0x1d1271);
    if (local_f18 == (float *)0x0) {
      in_stack_ffffffffffffe664 = 0.0;
    }
    else {
      in_stack_ffffffffffffe664 = local_f18[local_165c];
    }
    local_16b4 = in_stack_ffffffffffffe664;
    local_1668 = in_stack_ffffffffffffe668;
    for (local_16b8 = 0; local_16b8 + 3 < local_11a0; local_16b8 = local_16b8 + 4) {
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_1708);
      Mat::~Mat((Mat *)0x1d132e);
      local_16c0 = pfVar15;
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_1758);
      Mat::~Mat((Mat *)0x1d1392);
      local_df8 = local_16b4;
      local_e08 = local_16b4;
      local_1768 = (void *)CONCAT44(local_16b4,local_16b4);
      uStack_1760 = (int *)CONCAT44(local_16b4,local_16b4);
      local_1710 = pfVar15;
      for (local_176c = 0; local_176c + 3 < local_11a4; local_176c = local_176c + 4) {
        local_e28 = *local_1710;
        local_1788 = CONCAT44(local_e28,local_e28);
        uStack_1780 = CONCAT44(local_e28,local_e28);
        local_e48 = local_1710[1];
        local_1798 = CONCAT44(local_e48,local_e48);
        uStack_1790 = CONCAT44(local_e48,local_e48);
        local_e68 = local_1710[2];
        local_17a8 = CONCAT44(local_e68,local_e68);
        uStack_17a0 = CONCAT44(local_e68,local_e68);
        local_e88 = local_1710[3];
        local_17b8 = CONCAT44(local_e88,local_e88);
        uStack_17b0 = CONCAT44(local_e88,local_e88);
        local_9a0 = local_16c0;
        local_17c8 = *(undefined8 *)local_16c0;
        uStack_17c0 = *(undefined8 *)(local_16c0 + 2);
        local_9a8 = local_16c0 + 4;
        local_17d8 = *(undefined8 *)local_9a8;
        uStack_17d0 = *(undefined8 *)(local_16c0 + 6);
        local_9b0 = local_16c0 + 8;
        local_17e8 = *(undefined8 *)local_9b0;
        uStack_17e0 = *(undefined8 *)(local_16c0 + 10);
        local_9b8 = local_16c0 + 0xc;
        local_17f8 = *(undefined8 *)local_9b8;
        uStack_17f0 = *(undefined8 *)(local_16c0 + 0xe);
        pvVar13 = local_1768;
        piVar14 = uStack_1760;
        local_428._0_4_ = (float)local_17c8;
        local_428._4_4_ = (float)((ulong)local_17c8 >> 0x20);
        uStack_420._0_4_ = (float)uStack_17c0;
        uStack_420._4_4_ = (float)((ulong)uStack_17c0 >> 0x20);
        local_898 = (float)local_428 * local_e28;
        fStack_894 = local_428._4_4_ * local_e28;
        fStack_890 = (float)uStack_420 * local_e28;
        fStack_88c = uStack_420._4_4_ * local_e28;
        local_888._0_4_ = SUB84(local_1768,0);
        local_888._4_4_ = (float)((ulong)local_1768 >> 0x20);
        uStack_880._0_4_ = SUB84(uStack_1760,0);
        uStack_880._4_4_ = (float)((ulong)uStack_1760 >> 0x20);
        local_1768 = (void *)CONCAT44(local_888._4_4_ + fStack_894,(float)local_888 + local_898);
        uStack_1760 = (int *)CONCAT44(uStack_880._4_4_ + fStack_88c,(float)uStack_880 + fStack_890);
        local_8a8 = local_1768;
        uStack_8a0 = uStack_1760;
        local_448._0_4_ = (float)local_17d8;
        local_448._4_4_ = (float)((ulong)local_17d8 >> 0x20);
        uStack_440._0_4_ = (float)uStack_17d0;
        uStack_440._4_4_ = (float)((ulong)uStack_17d0 >> 0x20);
        local_8b8 = (float)local_448 * local_e48;
        fStack_8b4 = local_448._4_4_ * local_e48;
        fStack_8b0 = (float)uStack_440 * local_e48;
        fStack_8ac = uStack_440._4_4_ * local_e48;
        fVar16 = (float)local_888 + local_898 + local_8b8;
        fVar17 = local_888._4_4_ + fStack_894 + fStack_8b4;
        fVar18 = (float)uStack_880 + fStack_890 + fStack_8b0;
        fVar19 = uStack_880._4_4_ + fStack_88c + fStack_8ac;
        local_1768 = (void *)CONCAT44(fVar17,fVar16);
        uStack_1760 = (int *)CONCAT44(fVar19,fVar18);
        local_8c8 = local_1768;
        uStack_8c0 = uStack_1760;
        local_468._0_4_ = (float)local_17e8;
        local_468._4_4_ = (float)((ulong)local_17e8 >> 0x20);
        uStack_460._0_4_ = (float)uStack_17e0;
        uStack_460._4_4_ = (float)((ulong)uStack_17e0 >> 0x20);
        local_8d8 = (float)local_468 * local_e68;
        fStack_8d4 = local_468._4_4_ * local_e68;
        fStack_8d0 = (float)uStack_460 * local_e68;
        fStack_8cc = uStack_460._4_4_ * local_e68;
        fVar16 = fVar16 + local_8d8;
        fVar17 = fVar17 + fStack_8d4;
        fVar18 = fVar18 + fStack_8d0;
        fVar19 = fVar19 + fStack_8cc;
        local_1768 = (void *)CONCAT44(fVar17,fVar16);
        uStack_1760 = (int *)CONCAT44(fVar19,fVar18);
        local_8e8 = local_1768;
        uStack_8e0 = uStack_1760;
        local_488._0_4_ = (float)local_17f8;
        local_488._4_4_ = (float)((ulong)local_17f8 >> 0x20);
        uStack_480._0_4_ = (float)uStack_17f0;
        uStack_480._4_4_ = (float)((ulong)uStack_17f0 >> 0x20);
        local_8f8 = (float)local_488 * local_e88;
        fStack_8f4 = local_488._4_4_ * local_e88;
        fStack_8f0 = (float)uStack_480 * local_e88;
        fStack_8ec = uStack_480._4_4_ * local_e88;
        local_1768 = (void *)CONCAT44(fVar17 + fStack_8f4,fVar16 + local_8f8);
        uStack_1760 = (int *)CONCAT44(fVar19 + fStack_8ec,fVar18 + fStack_8f0);
        local_1710 = local_1710 + 4;
        local_16c0 = local_16c0 + 0x10;
        fStack_e84 = local_e88;
        fStack_e80 = local_e88;
        fStack_e7c = local_e88;
        local_e78 = local_e88;
        fStack_e64 = local_e68;
        fStack_e60 = local_e68;
        fStack_e5c = local_e68;
        local_e4c = local_e68;
        fStack_e44 = local_e48;
        fStack_e40 = local_e48;
        fStack_e3c = local_e48;
        local_e2c = local_e48;
        fStack_e24 = local_e28;
        fStack_e20 = local_e28;
        fStack_e1c = local_e28;
        local_e0c = local_e28;
        local_888 = pvVar13;
        uStack_880 = piVar14;
        local_498 = local_17b8;
        uStack_490 = uStack_17b0;
        local_488 = local_17f8;
        uStack_480 = uStack_17f0;
        local_478 = local_17a8;
        uStack_470 = uStack_17a0;
        local_468 = local_17e8;
        uStack_460 = uStack_17e0;
        local_458 = local_1798;
        uStack_450 = uStack_1790;
        local_448 = local_17d8;
        uStack_440 = uStack_17d0;
        local_438 = local_1788;
        uStack_430 = uStack_1780;
        local_428 = local_17c8;
        uStack_420 = uStack_17c0;
      }
      for (; local_176c < local_11a4; local_176c = local_176c + 1) {
        local_ea8 = *local_1710;
        local_1808 = CONCAT44(local_ea8,local_ea8);
        uStack_1800 = CONCAT44(local_ea8,local_ea8);
        local_9c0 = local_16c0;
        local_1818 = *(undefined8 *)local_16c0;
        uStack_1810 = *(undefined8 *)(local_16c0 + 2);
        pvVar13 = local_1768;
        piVar14 = uStack_1760;
        local_4a8._0_4_ = (float)local_1818;
        local_4a8._4_4_ = (float)((ulong)local_1818 >> 0x20);
        uStack_4a0._0_4_ = (float)uStack_1810;
        uStack_4a0._4_4_ = (float)((ulong)uStack_1810 >> 0x20);
        local_918 = (float)local_4a8 * local_ea8;
        fStack_914 = local_4a8._4_4_ * local_ea8;
        fStack_910 = (float)uStack_4a0 * local_ea8;
        fStack_90c = uStack_4a0._4_4_ * local_ea8;
        local_908._0_4_ = SUB84(local_1768,0);
        local_908._4_4_ = (float)((ulong)local_1768 >> 0x20);
        uStack_900._0_4_ = SUB84(uStack_1760,0);
        uStack_900._4_4_ = (float)((ulong)uStack_1760 >> 0x20);
        local_1768 = (void *)CONCAT44(local_908._4_4_ + fStack_914,(float)local_908 + local_918);
        uStack_1760 = (int *)CONCAT44(uStack_900._4_4_ + fStack_90c,(float)uStack_900 + fStack_910);
        local_1710 = local_1710 + 1;
        local_16c0 = local_16c0 + 4;
        fStack_ea4 = local_ea8;
        fStack_ea0 = local_ea8;
        fStack_e9c = local_ea8;
        local_e98 = local_ea8;
        local_908 = pvVar13;
        uStack_900 = piVar14;
        local_4b8 = local_1808;
        uStack_4b0 = uStack_1800;
        local_4a8 = local_1818;
        uStack_4a0 = uStack_1810;
      }
      local_c0 = local_1668;
      local_d8 = local_1768;
      piStack_d0 = uStack_1760;
      local_1668->data = local_1768;
      local_1668->refcount = uStack_1760;
      local_1668 = (Mat *)&local_1668->elemsize;
      fStack_e04 = local_e08;
      fStack_e00 = local_e08;
      fStack_dfc = local_e08;
    }
    for (; local_16b8 < local_11a0; local_16b8 = local_16b8 + 1) {
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_1868);
      Mat::~Mat((Mat *)0x1d1983);
      local_1820 = pfVar15;
      Mat::channel(in_stack_ffffffffffffe668,(int)in_stack_ffffffffffffe664);
      pfVar15 = Mat::operator_cast_to_float_(&local_18b8);
      Mat::~Mat((Mat *)0x1d19e7);
      local_18bc = 0;
      local_eb8 = 0;
      local_ec8 = 0;
      uStack_ec4 = 0;
      uStack_ec0 = 0;
      uStack_ebc = 0;
      local_18d8 = 0;
      uStack_18d0 = 0;
      local_1870 = pfVar15;
      while( true ) {
        uVar2 = uStack_920;
        uVar1 = local_928;
        local_928._0_4_ = (float)local_18d8;
        local_928._4_4_ = (float)((ulong)local_18d8 >> 0x20);
        uStack_920._0_4_ = (float)uStack_18d0;
        uStack_920._4_4_ = (float)((ulong)uStack_18d0 >> 0x20);
        if (local_11a4 <= local_18bc + 3) break;
        local_9c8 = local_1820;
        local_18e8 = *(undefined8 *)local_1820;
        uStack_18e0 = *(undefined8 *)(local_1820 + 2);
        local_9d0 = local_1870;
        local_18f8 = *(undefined8 *)local_1870;
        uStack_18f0 = *(undefined8 *)(local_1870 + 2);
        uVar1 = local_18d8;
        uVar2 = uStack_18d0;
        local_4c8._0_4_ = (float)local_18e8;
        local_4c8._4_4_ = (float)((ulong)local_18e8 >> 0x20);
        uStack_4c0._0_4_ = (float)uStack_18e0;
        uStack_4c0._4_4_ = (float)((ulong)uStack_18e0 >> 0x20);
        local_4d8._0_4_ = (float)local_18f8;
        local_4d8._4_4_ = (float)((ulong)local_18f8 >> 0x20);
        uStack_4d0._0_4_ = (float)uStack_18f0;
        uStack_4d0._4_4_ = (float)((ulong)uStack_18f0 >> 0x20);
        local_938 = (float)local_4c8 * (float)local_4d8;
        fStack_934 = local_4c8._4_4_ * local_4d8._4_4_;
        fStack_930 = (float)uStack_4c0 * (float)uStack_4d0;
        fStack_92c = uStack_4c0._4_4_ * uStack_4d0._4_4_;
        local_18d8 = CONCAT44(local_928._4_4_ + fStack_934,(float)local_928 + local_938);
        uStack_18d0 = CONCAT44(uStack_920._4_4_ + fStack_92c,(float)uStack_920 + fStack_930);
        local_1870 = local_1870 + 4;
        local_1820 = local_1820 + 4;
        local_18bc = local_18bc + 4;
        local_928 = uVar1;
        uStack_920 = uVar2;
        local_4d8 = local_18f8;
        uStack_4d0 = uStack_18f0;
        local_4c8 = local_18e8;
        uStack_4c0 = uStack_18e0;
      }
      local_e0 = local_1908;
      local_f8 = local_18d8;
      uStack_f0 = uStack_18d0;
      local_190c = local_16b4 + (float)local_928 + local_928._4_4_ + (float)uStack_920 +
                   uStack_920._4_4_;
      for (; local_18bc < local_11a4; local_18bc = local_18bc + 1) {
        local_190c = *local_1870 * *local_1820 + local_190c;
        local_1870 = local_1870 + 1;
        local_1820 = local_1820 + 1;
      }
      *(float *)&local_1668->data = local_190c;
      local_1668 = (Mat *)((long)&local_1668->data + 4);
      local_928 = uVar1;
      uStack_920 = uVar2;
    }
  }
  Mat::~Mat((Mat *)0x1d1cb7);
  Mat::~Mat((Mat *)0x1d1cc4);
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias,
                                  const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw * outh, kernel_h * kernel_w * inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h * kernel_w * outw * outh;
        float* ret = (float*)bottom_im2col;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }

    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb + 4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb + 8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb + 12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};

                int k = 0;
                for (; k + 7 < L; k = k + 8)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 4];
                        sum1[n] += va[1] * vb[n + 4];
                        sum2[n] += va[2] * vb[n + 4];
                        sum3[n] += va[3] * vb[n + 4];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 8];
                        sum1[n] += va[1] * vb[n + 8];
                        sum2[n] += va[2] * vb[n + 8];
                        sum3[n] += va[3] * vb[n + 8];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 12];
                        sum1[n] += va[1] * vb[n + 12];
                        sum2[n] += va[2] * vb[n + 12];
                        sum3[n] += va[3] * vb[n + 12];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 16];
                        sum1[n] += va[1] * vb[n + 16];
                        sum2[n] += va[2] * vb[n + 16];
                        sum3[n] += va[3] * vb[n + 16];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 20];
                        sum1[n] += va[1] * vb[n + 20];
                        sum2[n] += va[2] * vb[n + 20];
                        sum3[n] += va[3] * vb[n + 20];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 24];
                        sum1[n] += va[1] * vb[n + 24];
                        sum2[n] += va[2] * vb[n + 24];
                        sum3[n] += va[3] * vb[n + 24];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 28];
                        sum1[n] += va[1] * vb[n + 28];
                        sum2[n] += va[2] * vb[n + 28];
                        sum3[n] += va[3] * vb[n + 28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va + 4);
                    __m128 _va2 = _mm_loadu_ps(va + 8);
                    __m128 _va3 = _mm_loadu_ps(va + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0)); // sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1)); // sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2)); // sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3)); // sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k < L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va);

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0)); // sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }

                float sum0_3_tmp[4];
                _mm_storeu_ps(sum0_3_tmp, _sum0_3);
                output0[0] = sum0_3_tmp[0];
                output1[0] = sum0_3_tmp[1];
                output2[0] = sum0_3_tmp[2];
                output3[0] = sum0_3_tmp[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k = 0; k < L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb + 4);
                    __m128 _vb2 = _mm_loadu_ps(vb + 8);
                    __m128 _vb3 = _mm_loadu_ps(vb + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1)); // sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2)); // sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3)); // sum0 += (a30-a33) * k03

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0);
#else
                float sum[4] = {0};

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n + 4];
                        sum[n] += va[2] * vb[n + 8];
                        sum[n] += va[3] * vb[n + 12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);

                int k = 0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k + 3 < L; k += 4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;
                }
                float sum0_tmp[4];
                _mm_storeu_ps(sum0_tmp, _sum0);
                float sum0 = bias0 + sum0_tmp[0] + sum0_tmp[1] + sum0_tmp[2] + sum0_tmp[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k < L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }
}